

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  ulong uVar2;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  uVar2 = (ulong)(byte)this->field_0x8;
  switch(uVar2) {
  case 0:
    break;
  case 2:
    bVar1 = isInt64(this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"LargestUInt out of Int64 range",0x1e);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
      goto LAB_00123267;
    }
  case 1:
    uVar2 = (this->value_).int_;
    break;
  case 3:
    if (ABS((this->value_).real_) <= 9.223372036854776e+18) {
      return (long)(this->value_).real_;
    }
LAB_00123267:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"double out of Int64 range",0x19);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
switchD_001231e9_caseD_4:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to Int64.",0x22);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream(local_180);
    std::ios_base::~ios_base(local_110);
    _Unwind_Resume(extraout_RAX);
  default:
    goto switchD_001231e9_caseD_4;
  case 5:
    uVar2 = (ulong)(this->value_).bool_;
  }
  return uVar2;
}

Assistant:

Value::Int64 Value::asInt64() const {
  switch (type_) {
  case intValue:
    return Int64(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt64(), "LargestUInt out of Int64 range");
    return Int64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt64, maxInt64),
                        "double out of Int64 range");
    return Int64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int64.");
}